

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
emplace_back<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
          (SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *this,
          TransRangeSyntax *args,Type *args_1,ASTContext *args_2)

{
  size_type sVar1;
  pointer pTVar2;
  
  if (this->len == this->cap) {
    pTVar2 = emplaceRealloc<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
                       (this,this->data_ + this->len,args,args_1,args_2);
    return pTVar2;
  }
  ast::CoverageBinSymbol::TransRangeList::TransRangeList(this->data_ + this->len,args,args_1,args_2)
  ;
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }